

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# perfetto.cc
# Opt level: O0

void __thiscall
perfetto::protos::gen::FieldDescriptorProto::Serialize(FieldDescriptorProto *this,Message *msg)

{
  bool bVar1;
  void *data;
  size_t size;
  Message *msg_local;
  FieldDescriptorProto *this_local;
  
  bVar1 = ::std::bitset<10UL>::operator[]((bitset<10UL> *)&this->_has_field_,1);
  if (bVar1) {
    protozero::Message::AppendString(msg,1,&this->name_);
  }
  bVar1 = ::std::bitset<10UL>::operator[]((bitset<10UL> *)&this->_has_field_,3);
  if (bVar1) {
    protozero::Message::AppendVarInt<int>(msg,3,this->number_);
  }
  bVar1 = ::std::bitset<10UL>::operator[]((bitset<10UL> *)&this->_has_field_,4);
  if (bVar1) {
    protozero::Message::AppendVarInt<perfetto::protos::gen::FieldDescriptorProto_Label>
              (msg,4,this->label_);
  }
  bVar1 = ::std::bitset<10UL>::operator[]((bitset<10UL> *)&this->_has_field_,5);
  if (bVar1) {
    protozero::Message::AppendVarInt<perfetto::protos::gen::FieldDescriptorProto_Type>
              (msg,5,this->type_);
  }
  bVar1 = ::std::bitset<10UL>::operator[]((bitset<10UL> *)&this->_has_field_,6);
  if (bVar1) {
    protozero::Message::AppendString(msg,6,&this->type_name_);
  }
  bVar1 = ::std::bitset<10UL>::operator[]((bitset<10UL> *)&this->_has_field_,2);
  if (bVar1) {
    protozero::Message::AppendString(msg,2,&this->extendee_);
  }
  bVar1 = ::std::bitset<10UL>::operator[]((bitset<10UL> *)&this->_has_field_,7);
  if (bVar1) {
    protozero::Message::AppendString(msg,7,&this->default_value_);
  }
  bVar1 = ::std::bitset<10UL>::operator[]((bitset<10UL> *)&this->_has_field_,9);
  if (bVar1) {
    protozero::Message::AppendVarInt<int>(msg,9,this->oneof_index_);
  }
  data = (void *)::std::__cxx11::string::data();
  size = ::std::__cxx11::string::size();
  protozero::Message::AppendRawProtoBytes(msg,data,size);
  return;
}

Assistant:

void FieldDescriptorProto::Serialize(::protozero::Message* msg) const {
  // Field 1: name
  if (_has_field_[1]) {
    msg->AppendString(1, name_);
  }

  // Field 3: number
  if (_has_field_[3]) {
    msg->AppendVarInt(3, number_);
  }

  // Field 4: label
  if (_has_field_[4]) {
    msg->AppendVarInt(4, label_);
  }

  // Field 5: type
  if (_has_field_[5]) {
    msg->AppendVarInt(5, type_);
  }

  // Field 6: type_name
  if (_has_field_[6]) {
    msg->AppendString(6, type_name_);
  }

  // Field 2: extendee
  if (_has_field_[2]) {
    msg->AppendString(2, extendee_);
  }

  // Field 7: default_value
  if (_has_field_[7]) {
    msg->AppendString(7, default_value_);
  }

  // Field 9: oneof_index
  if (_has_field_[9]) {
    msg->AppendVarInt(9, oneof_index_);
  }

  msg->AppendRawProtoBytes(unknown_fields_.data(), unknown_fields_.size());
}